

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cpp
# Opt level: O2

void __thiscall
Importer_isResolvedComponentOverTwoLevelsUnresolved_Test::
Importer_isResolvedComponentOverTwoLevelsUnresolved_Test
          (Importer_isResolvedComponentOverTwoLevelsUnresolved_Test *this)

{
  testing::Test::Test(&this->super_Test);
  *(undefined ***)this = &PTR__Test_00168d50;
  return;
}

Assistant:

TEST(Importer, isResolvedComponentOverTwoLevelsUnresolved)
{
    auto parser = libcellml::Parser::create();
    auto model = parser->parseModel(fileContents("importer/component_importer_unresolved.cellml"));
    auto importer = libcellml::Importer::create();

    EXPECT_TRUE(model->hasUnresolvedImports());
    importer->resolveImports(model, resourcePath("importer/"));
    EXPECT_EQ(size_t(2), importer->libraryCount());

    auto component = model->component(0);

    EXPECT_FALSE(component->isResolved());

    EXPECT_TRUE(model->hasUnresolvedImports());
}